

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O1

void __thiscall pbrt::Object::readFrom(Object *this,BinaryReader *binary)

{
  ulong uVar1;
  pointer puVar2;
  runtime_error *this_00;
  size_t in_RCX;
  void *in_RDX;
  int iVar3;
  int ID;
  shared_ptr<pbrt::Instance> local_48;
  undefined1 local_38;
  undefined7 uStack_37;
  
  local_48.super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38 = 0;
  local_48.super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&stack0xffffffffffffffc8;
  BinaryReader::read(binary,(int)&local_48,in_RDX,in_RCX);
  std::__cxx11::string::operator=((string *)&this->name,(string *)&local_48);
  if (local_48.super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)&stack0xffffffffffffffc8) {
    operator_delete(local_48.super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    CONCAT71(uStack_37,local_38) + 1);
  }
  uVar1 = binary->currentEntityOffset + 4;
  puVar2 = (binary->currentEntityData).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(binary->currentEntityData).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar2) < uVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"invalid read attempt by entity - not enough data in data block!");
  }
  else {
    iVar3 = *(int *)(puVar2 + binary->currentEntityOffset);
    binary->currentEntityOffset = uVar1;
    ID = (int)binary;
    if (0 < iVar3) {
      do {
        uVar1 = binary->currentEntityOffset + 4;
        if ((ulong)((long)(binary->currentEntityData).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(binary->currentEntityData).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start) < uVar1) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (this_00,"invalid read attempt by entity - not enough data in data block!");
          goto LAB_00112ac8;
        }
        binary->currentEntityOffset = uVar1;
        BinaryReader::getEntity<pbrt::Shape>((BinaryReader *)&local_48,ID);
        std::vector<std::shared_ptr<pbrt::Shape>,std::allocator<std::shared_ptr<pbrt::Shape>>>::
        emplace_back<std::shared_ptr<pbrt::Shape>>
                  ((vector<std::shared_ptr<pbrt::Shape>,std::allocator<std::shared_ptr<pbrt::Shape>>>
                    *)&this->shapes,(shared_ptr<pbrt::Shape> *)&local_48);
        if (local_48.super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_48.super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
    uVar1 = binary->currentEntityOffset + 4;
    puVar2 = (binary->currentEntityData).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(binary->currentEntityData).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar2) < uVar1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"invalid read attempt by entity - not enough data in data block!");
    }
    else {
      iVar3 = *(int *)(puVar2 + binary->currentEntityOffset);
      binary->currentEntityOffset = uVar1;
      if (0 < iVar3) {
        do {
          uVar1 = binary->currentEntityOffset + 4;
          if ((ulong)((long)(binary->currentEntityData).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(binary->currentEntityData).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start) < uVar1) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (this_00,"invalid read attempt by entity - not enough data in data block!");
            goto LAB_00112ac8;
          }
          binary->currentEntityOffset = uVar1;
          BinaryReader::getEntity<pbrt::LightSource>((BinaryReader *)&local_48,ID);
          std::
          vector<std::shared_ptr<pbrt::LightSource>,std::allocator<std::shared_ptr<pbrt::LightSource>>>
          ::emplace_back<std::shared_ptr<pbrt::LightSource>>
                    ((vector<std::shared_ptr<pbrt::LightSource>,std::allocator<std::shared_ptr<pbrt::LightSource>>>
                      *)&this->lightSources,(shared_ptr<pbrt::LightSource> *)&local_48);
          if (local_48.super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_48.super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
      uVar1 = binary->currentEntityOffset + 4;
      puVar2 = (binary->currentEntityData).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (uVar1 <= (ulong)((long)(binary->currentEntityData).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar2)) {
        iVar3 = *(int *)(puVar2 + binary->currentEntityOffset);
        binary->currentEntityOffset = uVar1;
        if (0 < iVar3) {
          do {
            uVar1 = binary->currentEntityOffset + 4;
            if ((ulong)((long)(binary->currentEntityData).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(binary->currentEntityData).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start) < uVar1) {
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error
                        (this_00,"invalid read attempt by entity - not enough data in data block!");
              goto LAB_00112ac8;
            }
            binary->currentEntityOffset = uVar1;
            BinaryReader::getEntity<pbrt::Instance>((BinaryReader *)&local_48,ID);
            std::
            vector<std::shared_ptr<pbrt::Instance>,std::allocator<std::shared_ptr<pbrt::Instance>>>
            ::emplace_back<std::shared_ptr<pbrt::Instance>>
                      ((vector<std::shared_ptr<pbrt::Instance>,std::allocator<std::shared_ptr<pbrt::Instance>>>
                        *)&this->instances,&local_48);
            if (local_48.super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_48.super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            iVar3 = iVar3 + -1;
          } while (iVar3 != 0);
        }
        return;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"invalid read attempt by entity - not enough data in data block!");
    }
  }
LAB_00112ac8:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Object::readFrom(BinaryReader &binary) 
  {
    name = binary.read<std::string>();

    // read shapes
    int32_t numShapes = binary.read<int32_t>();
    assert(shapes.empty());
    for (int32_t i=0;i<numShapes;i++)
      shapes.push_back(binary.getEntity<Shape>(binary.read<int32_t>()));

    // read lightSources
    int numLightSources = binary.read<int32_t>();
    assert(lightSources.empty());
    for (int i=0;i<numLightSources;i++)
      lightSources.push_back(binary.getEntity<LightSource>(binary.read<int32_t>()));

    // read instances
    int32_t numInstances = binary.read<int32_t>();
    assert(instances.empty());
    for (int32_t i=0;i<numInstances;i++)
      instances.push_back(binary.getEntity<Instance>(binary.read<int32_t>()));
  }